

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O2

void __thiscall embree::MatteMaterial::MatteMaterial(MatteMaterial *this,Vec3fa *reflectance)

{
  undefined8 uVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  SceneGraph::MaterialNode::MaterialNode(&this->super_MaterialNode,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_MaterialNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__Node_002a91f0;
  (this->base).type = 6;
  uVar1 = *(undefined8 *)((long)&reflectance->field_0 + 8);
  *(undefined8 *)&(this->reflectance).field_0 = *(undefined8 *)&reflectance->field_0;
  *(undefined8 *)((long)&(this->reflectance).field_0 + 8) = uVar1;
  return;
}

Assistant:

MatteMaterial (const Vec3fa& reflectance)
      : base(MATERIAL_MATTE), reflectance(reflectance) {}